

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::SliceDynamicLayerParams::_internal_add_strides
          (SliceDynamicLayerParams *this,int64_t value)

{
  int64_t local_18;
  int64_t value_local;
  SliceDynamicLayerParams *this_local;
  
  local_18 = value;
  value_local = (int64_t)this;
  google::protobuf::RepeatedField<long>::Add(&this->strides_,&local_18);
  return;
}

Assistant:

inline void SliceDynamicLayerParams::_internal_add_strides(int64_t value) {
  strides_.Add(value);
}